

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool perfetto::internal::TrackEventInternal::Initialize
               (TrackEventCategoryRegistry *registry,
               _func_bool_DataSourceDescriptor_ptr *register_data_source)

{
  Category *pCVar1;
  char *__s;
  _func_bool_DataSourceDescriptor_ptr *p_Var2;
  bool bVar3;
  int iVar4;
  TrackEventCategory *this;
  ulong uVar5;
  long lVar6;
  Category *pCVar7;
  long local_270;
  string local_268;
  _func_bool_DataSourceDescriptor_ptr *local_248;
  TrackEventCategoryRegistry *local_240;
  ulong local_238;
  HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor> ted;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  DataSourceDescriptor dsd;
  
  if (_ZN8perfetto8internal12_GLOBAL__N_113g_main_threadE_0 == 0) {
    _ZN8perfetto8internal12_GLOBAL__N_113g_main_threadE_0 = base::GetThreadId();
    LOCK();
    UNLOCK();
  }
  protos::gen::DataSourceDescriptor::DataSourceDescriptor(&dsd);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ted,"track_event",(allocator<char> *)&local_268);
  protos::gen::DataSourceDescriptor::set_name(&dsd,(string *)&ted);
  local_248 = register_data_source;
  ::std::__cxx11::string::~string((string *)&ted);
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::HeapBuffered(&ted);
  local_270 = 0x10;
  uVar5 = 0;
  local_240 = registry;
  while (uVar5 < registry->category_count_) {
    pCVar1 = registry->categories_;
    local_238 = uVar5;
    if (pCVar1[uVar5].name_sizes_._M_elems[1] == '\0') {
      this = protos::pbzero::TrackEventDescriptor::
             add_available_categories<perfetto::protos::pbzero::TrackEventCategory>
                       (&ted.msg_.super_TrackEventDescriptor);
      pCVar7 = pCVar1 + uVar5;
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,pCVar7->name,(allocator<char> *)&local_268);
      protos::pbzero::TrackEventCategory::set_name(this,&local_110);
      ::std::__cxx11::string::~string((string *)&local_110);
      if (pCVar7->description != (char *)0x0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,pCVar7->description,(allocator<char> *)&local_268);
        protos::pbzero::TrackEventCategory::set_description(this,&local_130);
        ::std::__cxx11::string::~string((string *)&local_130);
      }
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        __s = *(char **)((long)(pCVar1->tags)._M_elems + lVar6 + local_270 + -0x10);
        if (__s != (char *)0x0) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,__s,(allocator<char> *)&local_268);
          protos::pbzero::TrackEventCategory::add_tags(this,&local_150);
          ::std::__cxx11::string::~string((string *)&local_150);
        }
      }
      iVar4 = strncmp(pCVar7->name,"disabled-by-default-",0x14);
      registry = local_240;
      if (iVar4 == 0) {
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"slow",(allocator<char> *)&local_268);
        protos::pbzero::TrackEventCategory::add_tags(this,&local_170);
        ::std::__cxx11::string::~string((string *)&local_170);
      }
    }
    local_270 = local_270 + 0x38;
    uVar5 = local_238 + 1;
  }
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackEventDescriptor>::
  SerializeAsString_abi_cxx11_(&local_268,&ted);
  protos::gen::DataSourceDescriptor::set_track_event_descriptor_raw(&dsd,&local_268);
  p_Var2 = local_248;
  ::std::__cxx11::string::~string((string *)&local_268);
  bVar3 = (*p_Var2)(&dsd);
  protozero::MessageArena::~MessageArena(&ted.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&ted.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&ted.shb_);
  protos::gen::DataSourceDescriptor::~DataSourceDescriptor(&dsd);
  return bVar3;
}

Assistant:

bool TrackEventInternal::Initialize(
    const TrackEventCategoryRegistry& registry,
    bool (*register_data_source)(const DataSourceDescriptor&)) {
  if (!g_main_thread)
    g_main_thread = perfetto::base::GetThreadId();

  DataSourceDescriptor dsd;
  dsd.set_name("track_event");

  protozero::HeapBuffered<protos::pbzero::TrackEventDescriptor> ted;
  for (size_t i = 0; i < registry.category_count(); i++) {
    auto category = registry.GetCategory(i);
    // Don't register group categories.
    if (category->IsGroup())
      continue;
    auto cat = ted->add_available_categories();
    cat->set_name(category->name);
    if (category->description)
      cat->set_description(category->description);
    for (const auto& tag : category->tags) {
      if (tag)
        cat->add_tags(tag);
    }
    // Disabled-by-default categories get a "slow" tag.
    if (!strncmp(category->name, kLegacySlowPrefix, strlen(kLegacySlowPrefix)))
      cat->add_tags(kSlowTag);
  }
  dsd.set_track_event_descriptor_raw(ted.SerializeAsString());

  return register_data_source(dsd);
}